

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::GetTrim3dStart(ON_Brep *this,int trim_index,ON_3dPoint *P)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ON_BrepTrim *pOVar5;
  ON_Surface *this_00;
  ON_3dPoint uv;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  ON_Interval local_38;
  
  local_48 = ON_3dPoint::NanPoint.z;
  local_58 = ON_3dPoint::NanPoint.x._0_4_;
  uStack_54 = ON_3dPoint::NanPoint.x._4_4_;
  uStack_50 = ON_3dPoint::NanPoint.y._0_4_;
  uStack_4c = ON_3dPoint::NanPoint.y._4_4_;
  this_00 = (ON_Surface *)0x0;
  if ((-1 < trim_index) &&
     (trim_index <
      (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count)) {
    pOVar5 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    iVar1 = pOVar5[(uint)trim_index].m_li;
    this_00 = (ON_Surface *)0x0;
    if ((-1 < (long)iVar1) &&
       (this_00 = (ON_Surface *)0x0,
       iVar1 < (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
               m_count)) {
      iVar1 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
              [iVar1].m_fi;
      this_00 = (ON_Surface *)0x0;
      if ((-1 < (long)iVar1) &&
         (iVar1 < (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count)) {
        pOVar5 = pOVar5 + (uint)trim_index;
        (*(pOVar5->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])(pOVar5);
        this_00 = (ON_Surface *)0x0;
        pdVar4 = ON_Interval::operator[](&local_38,0);
        iVar3 = (*(pOVar5->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x3b])(SUB84(*pdVar4,0),pOVar5,0,3,&local_58,0,0);
        if ((char)iVar3 != '\0') {
          this_00 = ON_BrepFace::SurfaceOf
                              ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                               super_ON_ClassArray<ON_BrepFace>.m_a + iVar1);
        }
      }
    }
  }
  if (this_00 == (ON_Surface *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = ON_Surface::EvPoint(this_00,(double)CONCAT44(uStack_54,local_58),
                                (double)CONCAT44(uStack_4c,uStack_50),P,0,(int *)0x0);
  }
  return bVar2;
}

Assistant:

bool
ON_Brep::GetTrim3dStart(int trim_index,
                        ON_3dPoint& P
                        ) const
{
  const ON_Surface* srf = nullptr;
  ON_3dPoint uv(ON_3dPoint::NanPoint);
  if ( trim_index >= 0 && trim_index < m_T.Count() )
  {
    const ON_BrepTrim& trim = m_T[trim_index];
    if ( trim.m_li >= 0 && trim.m_li < m_L.Count() )
    {
      const int fi = m_L[trim.m_li].m_fi;
      if ( fi >= 0 && fi < m_F.Count() )
      {
        if ( trim.Evaluate(trim.Domain()[0],0,3,&uv.x) )
        {
          srf = m_F[fi].SurfaceOf();
        }
      }
    }
  }
  return (nullptr != srf && srf->EvPoint(uv.x, uv.y, P) ? true : false);
}